

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ecdsa_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,uchar *msghash32,
              uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  uchar *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  code *pcVar13;
  uint uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int is_nonce_valid;
  int overflow;
  uchar b [32];
  uint local_290;
  uint local_28c;
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined8 uStack_270;
  uint local_264;
  uint local_260;
  int local_25c;
  uchar *local_258;
  void *local_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  secp256k1_modinv64_signed62 local_220;
  secp256k1_ecdsa_signature *local_1f8;
  secp256k1_context *local_1f0;
  uchar *local_1e8;
  secp256k1_nonce_function local_1e0;
  secp256k1_scalar local_1d8;
  secp256k1_gej local_1b8;
  uchar local_138 [40];
  secp256k1_ge local_110;
  secp256k1_scalar local_b8;
  secp256k1_scalar local_98;
  uchar local_78 [40];
  secp256k1_scalar local_50;
  uint uVar20;
  
  local_250 = noncedata;
  if ((ctx->ecmult_gen_ctx).built == 0) {
    secp256k1_ecdsa_sign_cold_4();
  }
  else if (msghash32 == (uchar *)0x0) {
    secp256k1_ecdsa_sign_cold_3();
  }
  else if (signature == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_ecdsa_sign_cold_2();
  }
  else {
    if (seckey != (uchar *)0x0) {
      local_248 = ZEXT816(0);
      local_238 = ZEXT816(0);
      local_288 = ZEXT816(0);
      local_278 = 0;
      uStack_270 = 0;
      pcVar13 = nonce_function_rfc6979;
      if (noncefp != (secp256k1_nonce_function)0x0) {
        pcVar13 = noncefp;
      }
      local_258 = seckey;
      secp256k1_scalar_set_b32(&local_98,seckey,(int *)&local_1b8);
      puVar1 = local_258;
      local_264 = (uint)(((local_98.d[2] != 0 || local_98.d[3] != 0) ||
                         (local_98.d[1] != 0 || local_98.d[0] != 0)) && (int)local_1b8.x.n[0] == 0);
      local_1b8.x.n[0] = CONCAT44(local_1b8.x.n[0]._4_4_,local_264) ^ 1;
      uVar9 = (long)(int)local_1b8.x.n[0] - 1;
      local_98.d[0] = local_1b8.x.n[0] & 0xffffffff | local_98.d[0] & uVar9;
      local_98.d[1] = local_98.d[1] & uVar9;
      local_98.d[2] = local_98.d[2] & uVar9;
      local_98.d[3] = uVar9 & local_98.d[3];
      uVar14 = 0;
      secp256k1_scalar_set_b32(&local_b8,msghash32,(int *)0x0);
      local_1e0 = pcVar13;
      iVar6 = (*pcVar13)(local_138,msghash32,puVar1,(uchar *)0x0,local_250,0);
      bVar15 = iVar6 != 0;
      auVar16 = (undefined1  [16])0x0;
      auVar18 = (undefined1  [16])0x0;
      auVar22 = (undefined1  [16])0x0;
      uVar12 = 0;
      uVar7 = 0;
      uVar11 = 0;
      uVar17 = 0;
      if (bVar15) {
        uVar12 = 1;
        local_1f8 = signature;
        local_1f0 = ctx;
        local_1e8 = msghash32;
        do {
          local_290 = (uint)bVar15;
          secp256k1_scalar_set_b32(&local_1d8,local_138,(int *)&local_1b8);
          uVar5 = local_1d8.d[3];
          uVar4 = local_1d8.d[2];
          uVar3 = local_1d8.d[1];
          uVar2 = local_1d8.d[0];
          local_28c = (uint)(((local_1d8.d[2] != 0 || local_1d8.d[3] != 0) ||
                             (local_1d8.d[1] != 0 || local_1d8.d[0] != 0)) &&
                            (int)local_1b8.x.n[0] == 0);
          if (ctx->declassify != 0) {
            local_1b8.x.n[0] = 0x4d430002;
            local_1b8.x.n[1] = (uint64_t)&local_28c;
            local_1b8.x.n[2] = 4;
            local_1b8.x.n[3] = 0;
            local_1b8.x.n[4] = 0;
            local_1b8.y.n[0] = 0;
            local_110.x.n[0] = 0;
          }
          if (local_28c != 0) {
            local_25c = 0;
            local_260 = uVar12;
            secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&local_1b8,&local_1d8);
            secp256k1_ge_set_gej(&local_110,&local_1b8);
            secp256k1_fe_impl_normalize(&local_110.x);
            secp256k1_fe_impl_normalize(&local_110.y);
            secp256k1_fe_impl_get_b32(local_78,&local_110.x);
            secp256k1_scalar_set_b32((secp256k1_scalar *)local_248,local_78,&local_25c);
            secp256k1_scalar_mul(&local_50,(secp256k1_scalar *)local_248,&local_98);
            secp256k1_scalar_add(&local_50,&local_50,&local_b8);
            local_220.v[0] = uVar2 & 0x3fffffffffffffff;
            local_220.v[1] = (uVar3 & 0xfffffffffffffff) << 2 | uVar2 >> 0x3e;
            local_220.v[2] = (uVar4 & 0x3ffffffffffffff) << 4 | uVar3 >> 0x3c;
            local_220.v[3] = (uVar5 & 0xffffffffffffff) << 6 | uVar4 >> 0x3a;
            local_220.v[4] = uVar5 >> 0x38;
            secp256k1_modinv64(&local_220,&secp256k1_const_modinfo_scalar);
            local_288._8_8_ = local_220.v[2] << 0x3c | (ulong)local_220.v[1] >> 2;
            local_288._0_8_ = local_220.v[1] << 0x3e | local_220.v[0];
            local_278 = local_220.v[3] << 0x3a | (ulong)local_220.v[2] >> 4;
            uStack_270 = local_220.v[4] << 0x38 | (ulong)local_220.v[3] >> 6;
            secp256k1_scalar_mul
                      ((secp256k1_scalar *)local_288,(secp256k1_scalar *)local_288,&local_50);
            uVar7 = (uint)(uStack_270 >> 0x3f);
            uVar11 = uVar7 ^ 1;
            uVar12 = uVar11;
            if (local_278 == 0xffffffffffffffff) {
              uVar12 = 0;
            }
            if (0x5d576e7357a4501c < (ulong)local_288._8_8_) {
              uVar11 = 0;
            }
            uVar11 = (uVar11 | uVar12 | uStack_270 < 0x7fffffffffffffff) ^ 1;
            uVar12 = 0;
            if (0xdfe92f46681b20a0 < (ulong)local_288._0_8_) {
              uVar12 = uVar11;
            }
            if (0x5d576e7357a4501d < (ulong)local_288._8_8_) {
              uVar12 = uVar11;
            }
            uVar9 = local_288._8_8_;
            secp256k1_scalar_cond_negate((secp256k1_scalar *)local_288,uVar12 | uVar7);
            auVar16._0_4_ = -(uint)(local_288._0_4_ == 0 && (uint)local_278 == 0);
            auVar16._4_4_ = -(uint)(local_288._4_4_ == 0 && local_278._4_4_ == 0);
            auVar16._8_4_ = -(uint)(local_288._8_4_ == 0 && (uint)uStack_270 == 0);
            auVar16._12_4_ = -(uint)(local_288._12_4_ == 0 && uStack_270._4_4_ == 0);
            iVar6 = movmskps((int)uVar9,auVar16);
            bVar15 = iVar6 != 0xf &&
                     ((local_248._8_8_ != 0 || local_238._8_8_ != 0) ||
                     (local_248._0_8_ != 0 || local_238._0_8_ != 0));
            local_290 = (uint)bVar15;
            if (local_1f0->declassify != 0) {
              local_1b8.x.n[0] = 0x4d430002;
              local_1b8.x.n[1] = (uint64_t)&local_290;
              local_1b8.x.n[2] = 4;
              local_1b8.x.n[3] = 0;
              local_1b8.x.n[4] = 0;
              local_1b8.y.n[0] = 0;
              local_110.x.n[0] = 0;
            }
            uVar14 = (uint)bVar15;
            ctx = local_1f0;
            uVar12 = local_260;
            if (uVar14 != 0) break;
          }
          uVar14 = 0;
          iVar6 = (*local_1e0)(local_138,local_1e8,local_258,(uchar *)0x0,local_250,uVar12);
          uVar12 = uVar12 + 1;
          bVar15 = iVar6 != 0;
        } while (bVar15);
        signature = local_1f8;
        auVar16 = local_288;
        auVar18 = local_238;
        auVar22 = local_248;
        uVar12 = (uint)local_278;
        uVar7 = local_278._4_4_;
        uVar11 = (uint)uStack_270;
        uVar17 = uStack_270._4_4_;
      }
      uVar8 = uVar14 & local_264 ^ 1;
      lVar10 = (long)(int)uVar8 + -1;
      auVar21._8_4_ = (int)lVar10;
      auVar21._0_8_ = lVar10;
      auVar21._12_4_ = (int)((ulong)lVar10 >> 0x20);
      lVar10 = (long)(int)uVar8 + -1;
      uVar8 = (uint)lVar10;
      uVar20 = (uint)((ulong)lVar10 >> 0x20);
      auVar19._8_4_ = uVar8;
      auVar19._0_8_ = lVar10;
      auVar19._12_4_ = uVar20;
      local_278 = CONCAT44(uVar7 & uVar20,uVar12 & uVar8);
      uStack_270 = CONCAT44(uVar17 & uVar20,uVar11 & uVar8);
      local_238._0_8_ = SUB168(auVar18 & auVar21,0);
      local_238._8_8_ = SUB168(auVar18 & auVar21,8);
      *(undefined8 *)(signature->data + 0x10) = local_238._0_8_;
      *(undefined8 *)(signature->data + 0x18) = local_238._8_8_;
      local_248._0_8_ = SUB168(auVar22 & auVar21,0);
      local_248._8_8_ = SUB168(auVar22 & auVar21,8);
      *(undefined8 *)signature->data = local_248._0_8_;
      *(undefined8 *)(signature->data + 8) = local_248._8_8_;
      local_288._0_8_ = SUB168(auVar16 & auVar19,0);
      local_288._8_8_ = SUB168(auVar16 & auVar19,8);
      *(undefined8 *)(signature->data + 0x20) = local_288._0_8_;
      *(undefined8 *)(signature->data + 0x28) = local_288._8_8_;
      *(ulong *)(signature->data + 0x30) = local_278;
      *(ulong *)(signature->data + 0x38) = uStack_270;
      return uVar14 & local_264;
    }
    secp256k1_ecdsa_sign_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature *signature, const unsigned char *msghash32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, NULL, NULL, NULL, msghash32, seckey, noncefp, noncedata);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}